

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall vm::VM::Tscan<unsigned_char>(VM *this)

{
  istream *piVar1;
  undefined8 *puVar2;
  uchar value;
  
  piVar1 = std::operator>>((istream *)&std::cin,(char *)&value);
  if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) == 0) {
    PUSH<unsigned_char>(this,value);
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_00123d28;
  __cxa_throw(puVar2,&IOError::typeinfo,std::exception::~exception);
}

Assistant:

void VM::Tscan() {
    if (T value; std::cin >> value) {
        PUSH(value);
    }
    else {
        throw IOError();
    }
}